

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subst.c
# Opt level: O0

void realloc_strcat(char **str,char *append)

{
  size_t sVar1;
  char *__dest;
  int *piVar2;
  size_t local_28;
  size_t old_len;
  char *new_str;
  char *append_local;
  char **str_local;
  
  if (*str == (char *)0x0) {
    local_28 = 0;
  }
  else {
    local_28 = strlen(*str);
  }
  sVar1 = strlen(append);
  __dest = (char *)malloc(local_28 + sVar1 + 1);
  if (__dest == (char *)0x0) {
    piVar2 = __errno_location();
    lafe_errc(1,*piVar2,"Out of memory");
  }
  if (*str != (char *)0x0) {
    memcpy(__dest,*str,local_28);
  }
  strcpy(__dest + local_28,append);
  free(*str);
  *str = __dest;
  return;
}

Assistant:

static void
realloc_strcat(char **str, const char *append)
{
	char *new_str;
	size_t old_len;

	if (*str == NULL)
		old_len = 0;
	else
		old_len = strlen(*str);

	new_str = malloc(old_len + strlen(append) + 1);
	if (new_str == NULL)
		lafe_errc(1, errno, "Out of memory");
	if (*str != NULL)
		memcpy(new_str, *str, old_len);
	strcpy(new_str + old_len, append);
	free(*str);
	*str = new_str;
}